

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void prvTidyAccessibilityChecks(TidyDocImpl *doc)

{
  int iVar1;
  Bool BVar2;
  Node *node;
  ctmbstr __haystack;
  char *pcVar3;
  char *node_00;
  
  iVar1 = *(int *)((doc->config).value + 1);
  memset(&doc->access,0,0x148);
  (doc->access).PRIORITYCHK = iVar1;
  prvTidyDialogue(doc,0x1fa);
  CheckScriptKeyboardAccessible(doc,&doc->root);
  node_00 = (char *)doc;
  CheckForStyleAttribute(doc,&doc->root);
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) goto LAB_0014c659;
  node = prvTidyFindDocType(doc);
  if (node != (Node *)0x0) {
    if (node->end == 0) goto LAB_0014c659;
    __haystack = textFromOneNode(doc,node);
    BVar2 = prvTidyIsHTML5Mode(doc);
    if (BVar2 == no) {
      node_00 = "HTML PUBLIC";
      pcVar3 = strstr(__haystack,"HTML PUBLIC");
      if (pcVar3 != (char *)0x0) goto LAB_0014c659;
      node_00 = "html PUBLIC";
    }
    else {
      node_00 = "HTML";
      pcVar3 = strstr(__haystack,"HTML");
      if (pcVar3 != (char *)0x0) goto LAB_0014c659;
      node_00 = "html";
    }
    pcVar3 = strstr(__haystack,node_00);
    if (pcVar3 != (char *)0x0) goto LAB_0014c659;
  }
  node_00 = (char *)doc;
  prvTidyReportAccessError(doc,&doc->root,0x2b6);
LAB_0014c659:
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    BVar2 = CheckMissingStyleSheets(doc,(Node *)node_00);
    if (BVar2 == no) {
      prvTidyReportAccessError(doc,&doc->root,0x2b7);
    }
  }
  CheckForListElements(doc,&doc->root);
  AccessibilityCheckNode(doc,&doc->root);
  return;
}

Assistant:

void TY_(AccessibilityChecks)( TidyDocImpl* doc )
{
    /* Initialize */
    InitAccessibilityChecks( doc, cfg(doc, TidyAccessibilityCheckLevel) );

    /* Hello there, ladies and gentlemen... */
    TY_(Dialogue)( doc, STRING_HELLO_ACCESS );

    /* Checks all elements for script accessibility */
    CheckScriptKeyboardAccessible( doc, &doc->root );

    /* Checks entire document for the use of 'STYLE' attribute */
    CheckForStyleAttribute( doc, &doc->root );

    /* Checks for '!DOCTYPE' */
    CheckDocType( doc );

    
    /* Checks to see if stylesheets are used to control the layout */
    if ( Level2_Enabled( doc )
         && ! CheckMissingStyleSheets( doc, &doc->root ) )
    {
        TY_(ReportAccessError)( doc, &doc->root, STYLE_SHEET_CONTROL_PRESENTATION );
    }

    /* Check to see if any list elements are found within the document */
    CheckForListElements( doc, &doc->root );

    /* Recursively apply all remaining checks to 
    ** each node in document.
    */
    AccessibilityCheckNode( doc, &doc->root );

    /* Cleanup */
    FreeAccessibilityChecks( doc );
}